

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O0

tuple<long,_int> __thiscall
TPZHybridizeHDiv::SplitConnects
          (TPZHybridizeHDiv *this,TPZCompElSide *left,TPZStack<TPZCompElSide,_10> *cellsidestack,
          TPZVec<TPZCompMesh_*> *meshvec_Hybrid,bool isIntersectEnd)

{
  TPZCompMesh *this_00;
  TPZInterpolatedElement *pTVar1;
  byte bVar2;
  uchar uVar3;
  int iVar4;
  ostream *this_01;
  TPZCompMesh **ppTVar5;
  TPZCompEl *pTVar6;
  TPZInterpolatedElement ***pppTVar7;
  TPZGeoEl *pTVar8;
  TPZInterpolatedElement **ppTVar9;
  TPZCompEl **ppTVar10;
  TPZGeoElBC *this_02;
  long *__args;
  TPZManVector<TPZCompEl_*,_10> *this_03;
  TPZVec<TPZCompElSide> *in_RCX;
  TPZCompElSide *in_RDX;
  _Head_base<0UL,_long,_false> extraout_RDX;
  int *in_RSI;
  long lVar11;
  undefined8 in_RDI;
  TPZVec<TPZCompMesh_*> *in_R8;
  byte in_R9B;
  tuple<long,_int> tVar12;
  TPZInterpolatedElement *intel_2;
  TPZInterpolatedElement **__end1_3;
  TPZInterpolatedElement **__begin1_3;
  TPZManVector<TPZInterpolatedElement_*,_10> *__range1_3;
  TPZGeoElBC gbc_2;
  int lagmatid;
  int pressureorder;
  int64_t pressureindex;
  TPZCompEl *wrap_1;
  TPZCompEl **__end1_2;
  TPZCompEl **__begin1_2;
  TPZManVector<TPZCompEl_*,_10> *__range1_2;
  int wrapside_1;
  TPZInterpolatedElement *intelwrap;
  TPZCompEl *wrap;
  TPZGeoElBC gbc_1;
  TPZGeoElSide gelside;
  int prevorder;
  TPZConnect *con;
  TPZInterpolatedElement *intel_1;
  TPZCompElSide celside_1;
  TPZCompElSide *__end1_1;
  TPZCompElSide *__begin1_1;
  TPZStack<TPZCompElSide,_10> *__range1_1;
  int i;
  int wrapside;
  TPZInterpolatedElement *intel;
  TPZGeoElBC gbc;
  TPZCompEl *cel;
  TPZInterpolatedElement **__end1;
  TPZInterpolatedElement **__begin1;
  TPZManVector<TPZInterpolatedElement_*,_10> *__range1;
  TPZManVector<TPZCompEl_*,_10> wrapvec;
  TPZCompEl *wrapleft;
  int sideorder;
  TPZInterpolatedElement *inteltochange;
  TPZCompElSide *celside;
  TPZCompElSide *__end2;
  TPZCompElSide *__begin2;
  TPZStack<TPZCompElSide,_10> *__range2;
  int count;
  TPZManVector<TPZInterpolatedElement_*,_10> intelvec;
  TPZConnect *cleft;
  TPZInterpolatedElement *intelleft;
  TPZGeoElSide gleft;
  TPZCompMesh *fluxmesh;
  TPZCompMesh *in_stack_fffffffffffffb88;
  TPZGeoEl *in_stack_fffffffffffffb90;
  TPZCreateApproximationSpace *in_stack_fffffffffffffb98;
  TPZManVector<TPZCompEl_*,_10> *in_stack_fffffffffffffba0;
  TPZGeoEl *in_stack_fffffffffffffba8;
  long *local_438;
  TPZCompElSide *in_stack_fffffffffffffbf8;
  TPZCompElSide *in_stack_fffffffffffffc00;
  long *local_390;
  TPZInterpolatedElement *local_318;
  long *local_2c0;
  TPZInterpolatedElement **local_288;
  TPZGeoElBC local_278;
  int local_270;
  uint local_26c;
  long *local_268;
  TPZCompEl *local_260;
  TPZGeoEl *local_258;
  TPZGeoEl *local_250;
  TPZVec<TPZCompEl_*> *local_248;
  int local_23c;
  long *local_238;
  TPZCompEl *local_230;
  TPZGeoElBC local_228 [4];
  uint local_204;
  TPZConnect *local_200;
  TPZInterpolatedElement *local_1f8;
  TPZCompElSide local_1f0;
  TPZCompElSide *local_1e0;
  TPZCompElSide *local_1d8;
  TPZVec<TPZCompElSide> *local_1d0;
  int local_1c8;
  int local_1c4;
  long *local_1c0;
  TPZGeoElBC local_1b8;
  TPZInterpolatedElement *local_1b0;
  TPZInterpolatedElement **local_1a8;
  TPZInterpolatedElement **local_1a0;
  TPZVec<TPZInterpolatedElement_*> *local_198;
  TPZVec<TPZCompEl_*> local_190 [3];
  TPZCompEl *local_120;
  uint local_114;
  TPZInterpolatedElement *local_110;
  TPZCompElSide *local_108;
  TPZCompElSide *local_100;
  TPZCompElSide *local_f8;
  TPZVec<TPZCompElSide> *local_f0;
  int local_e4;
  TPZVec<TPZInterpolatedElement_*> local_e0 [3];
  TPZConnect *local_70;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  
  if ((*in_RSI == 0) || (in_RSI[1] == 0)) {
    this_01 = std::operator<<((ostream *)&std::cerr,
                              "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!"
                             );
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  ppTVar5 = TPZVec<TPZCompMesh_*>::operator[](in_R8,0);
  this_00 = *ppTVar5;
  TPZCompElSide::Reference((TPZCompElSide *)in_stack_fffffffffffffb98);
  pTVar6 = TPZCompElSide::Element(in_RDX);
  if (pTVar6 == (TPZCompEl *)0x0) {
    local_2c0 = (long *)0x0;
  }
  else {
    local_2c0 = (long *)__dynamic_cast(pTVar6,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo
                                       ,0);
  }
  iVar4 = TPZCompElSide::Side(in_RDX);
  (**(code **)(*local_2c0 + 0x2f8))(local_2c0,iVar4,1);
  TPZCompElSide::Side(in_RDX);
  local_70 = TPZInterpolatedElement::SideConnect
                       ((TPZInterpolatedElement *)in_stack_fffffffffffffba8,
                        (int)((ulong)in_stack_fffffffffffffba0 >> 0x20),
                        (int)in_stack_fffffffffffffba0);
  TPZVec<TPZCompElSide>::size(in_RCX);
  TPZManVector<TPZInterpolatedElement_*,_10>::TPZManVector
            ((TPZManVector<TPZInterpolatedElement_*,_10> *)in_stack_fffffffffffffba0,
             (int64_t)in_stack_fffffffffffffb98);
  local_e4 = 0;
  iVar4 = TPZConnect::HasDependency(local_70);
  if (iVar4 == 0) {
    local_f0 = in_RCX;
    local_f8 = TPZVec<TPZCompElSide>::begin(in_RCX);
    local_100 = TPZVec<TPZCompElSide>::end(local_f0);
    for (; local_f8 != local_100; local_f8 = local_f8 + 1) {
      local_108 = local_f8;
      TPZCompElSide::SplitConnect(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      pTVar6 = TPZCompElSide::Element(local_108);
      if (pTVar6 == (TPZCompEl *)0x0) {
        local_318 = (TPZInterpolatedElement *)0x0;
      }
      else {
        local_318 = (TPZInterpolatedElement *)
                    __dynamic_cast(pTVar6,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
      }
      local_110 = local_318;
      if (local_318 == (TPZInterpolatedElement *)0x0) {
        pzinternal::DebugStopImpl(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      pTVar1 = local_110;
      iVar4 = TPZCompElSide::Side(local_108);
      (**(code **)(*(long *)&(pTVar1->super_TPZInterpolationSpace).super_TPZCompEl + 0x2f8))
                (pTVar1,iVar4,1);
      pTVar1 = local_110;
      lVar11 = (long)local_e4;
      local_e4 = local_e4 + 1;
      ppTVar9 = TPZVec<TPZInterpolatedElement_*>::operator[](local_e0,lVar11);
      *ppTVar9 = pTVar1;
    }
  }
  else {
    pzinternal::DebugStopImpl(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  bVar2 = TPZConnect::Order(local_70);
  local_114 = (uint)bVar2;
  TPZCompMesh::SetDefaultOrder(this_00,local_114);
  TPZVec<TPZCompElSide>::size(in_RCX);
  TPZManVector<TPZCompEl_*,_10>::TPZManVector
            (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98);
  local_198 = local_e0;
  pppTVar7 = TPZVec<TPZInterpolatedElement_*>::begin(local_198);
  local_1a0 = *pppTVar7;
  local_1a8 = TPZVec<TPZInterpolatedElement_*>::end(local_198);
  for (; local_1a0 != local_1a8; local_1a0 = local_1a0 + 1) {
    local_1b0 = *local_1a0;
    pTVar8 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffb88);
    TPZGeoEl::ResetReference(pTVar8);
  }
  (**(code **)(*local_2c0 + 0x68))();
  (**(code **)(*local_2c0 + 0x2d8))(local_2c0,local_114);
  TPZGeoElBC::TPZGeoElBC
            ((TPZGeoElBC *)in_stack_fffffffffffffba0,(TPZGeoElSide *)in_stack_fffffffffffffb98,
             (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
  TPZCompMesh::ApproxSpace(this_00);
  TPZGeoElBC::CreatedElement(&local_1b8);
  local_120 = TPZCreateApproximationSpace::CreateCompEl
                        (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                         in_stack_fffffffffffffb88);
  bVar2 = TPZConnect::Order(local_70);
  if (bVar2 != local_114) {
    pzinternal::DebugStopImpl(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  if (local_120 == (TPZCompEl *)0x0) {
    local_390 = (long *)0x0;
  }
  else {
    local_390 = (long *)__dynamic_cast(local_120,&TPZCompEl::typeinfo,
                                       &TPZInterpolatedElement::typeinfo,0);
  }
  local_1c0 = local_390;
  pTVar8 = TPZGeoElBC::CreatedElement(&local_1b8);
  local_1c4 = (**(code **)(*(long *)pTVar8 + 0xf0))();
  local_1c4 = local_1c4 + -1;
  (**(code **)(*local_1c0 + 0x2f8))(local_1c0,local_1c4,1);
  pTVar8 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffb88);
  TPZGeoEl::ResetReference(pTVar8);
  pTVar8 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffb88);
  TPZGeoEl::ResetReference(pTVar8);
  pTVar8 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffb88);
  TPZGeoEl::ResetReference(pTVar8);
  local_1c8 = 0;
  local_1d0 = in_RCX;
  local_1d8 = TPZVec<TPZCompElSide>::begin(in_RCX);
  local_1e0 = TPZVec<TPZCompElSide>::end(local_1d0);
  for (; local_1d8 != local_1e0; local_1d8 = local_1d8 + 1) {
    TPZCompElSide::TPZCompElSide(&local_1f0,local_1d8);
    ppTVar9 = TPZVec<TPZInterpolatedElement_*>::operator[](local_e0,(long)local_1c8);
    local_1f8 = *ppTVar9;
    (**(code **)(*(long *)&(local_1f8->super_TPZInterpolationSpace).super_TPZCompEl + 0x68))();
    TPZCompElSide::Side(&local_1f0);
    local_200 = TPZInterpolatedElement::SideConnect
                          ((TPZInterpolatedElement *)in_stack_fffffffffffffba8,
                           (int)((ulong)in_stack_fffffffffffffba0 >> 0x20),
                           (int)in_stack_fffffffffffffba0);
    bVar2 = TPZConnect::Order(local_200);
    pTVar1 = local_1f8;
    local_204 = (uint)bVar2;
    uVar3 = TPZConnect::Order(local_200);
    (**(code **)(*(long *)&(pTVar1->super_TPZInterpolationSpace).super_TPZCompEl + 0x2d8))
              (pTVar1,uVar3);
    TPZCompElSide::Reference((TPZCompElSide *)in_stack_fffffffffffffb98);
    TPZGeoElBC::TPZGeoElBC
              ((TPZGeoElBC *)in_stack_fffffffffffffba0,(TPZGeoElSide *)in_stack_fffffffffffffb98,
               (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
    TPZCompMesh::ApproxSpace(this_00);
    TPZGeoElBC::CreatedElement(local_228);
    pTVar6 = TPZCreateApproximationSpace::CreateCompEl
                       (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                        in_stack_fffffffffffffb88);
    lVar11 = (long)local_1c8;
    local_1c8 = local_1c8 + 1;
    local_230 = pTVar6;
    ppTVar10 = TPZVec<TPZCompEl_*>::operator[](local_190,lVar11);
    *ppTVar10 = pTVar6;
    bVar2 = TPZConnect::Order(local_200);
    if (bVar2 != local_204) {
      pzinternal::DebugStopImpl(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    if (local_230 == (TPZCompEl *)0x0) {
      local_438 = (long *)0x0;
    }
    else {
      local_438 = (long *)__dynamic_cast(local_230,&TPZCompEl::typeinfo,
                                         &TPZInterpolatedElement::typeinfo,0);
    }
    local_238 = local_438;
    pTVar8 = TPZGeoElBC::CreatedElement(local_228);
    local_23c = (**(code **)(*(long *)pTVar8 + 0xf0))();
    local_23c = local_23c + -1;
    (**(code **)(*local_238 + 0x2f8))(local_238,local_23c,1);
    pTVar8 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffb88);
    TPZGeoEl::ResetReference(pTVar8);
    in_stack_fffffffffffffba8 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffb88);
    TPZGeoEl::ResetReference(in_stack_fffffffffffffba8);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1f53d1d);
  }
  (**(code **)(*(long *)local_120 + 0x68))();
  local_248 = local_190;
  this_02 = (TPZGeoElBC *)TPZVec<TPZCompEl_*>::begin(local_248);
  local_250 = this_02->fCreatedElement;
  pTVar8 = (TPZGeoEl *)TPZVec<TPZCompEl_*>::end(local_248);
  local_258 = pTVar8;
  for (; local_250 != local_258; local_250 = (TPZGeoEl *)&local_250->fMesh) {
    local_260 = *(TPZCompEl **)local_250;
    (**(code **)(*(long *)local_260 + 0x68))();
  }
  local_270 = in_RSI[1];
  if ((in_R9B & 1) != 0) {
    local_270 = in_RSI[2];
  }
  TPZGeoElBC::TPZGeoElBC
            (this_02,(TPZGeoElSide *)pTVar8,(int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
  pTVar8 = TPZGeoElBC::CreatedElement(&local_278);
  __args = (long *)TPZGeoEl::Index(pTVar8);
  local_26c = local_114;
  local_268 = __args;
  (**(code **)(*local_2c0 + 0x68))();
  this_03 = (TPZManVector<TPZCompEl_*,_10> *)TPZVec<TPZInterpolatedElement_*>::begin(local_e0);
  local_288 = (TPZInterpolatedElement **)(this_03->super_TPZVec<TPZCompEl_*>)._vptr_TPZVec;
  ppTVar9 = TPZVec<TPZInterpolatedElement_*>::end(local_e0);
  for (; local_288 != ppTVar9; local_288 = local_288 + 1) {
    (**(code **)(*(long *)&((*local_288)->super_TPZInterpolationSpace).super_TPZCompEl + 0x68))();
  }
  std::make_tuple<long&,int&>(__args,(int *)this_03);
  TPZManVector<TPZCompEl_*,_10>::~TPZManVector(this_03);
  TPZManVector<TPZInterpolatedElement_*,_10>::~TPZManVector
            ((TPZManVector<TPZInterpolatedElement_*,_10> *)this_03);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1f53f76);
  tVar12.super__Tuple_impl<0UL,_long,_int>.super__Head_base<0UL,_long,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  tVar12.super__Tuple_impl<0UL,_long,_int>._0_8_ = in_RDI;
  return (tuple<long,_int>)tVar12.super__Tuple_impl<0UL,_long,_int>;
}

Assistant:

std::tuple<int64_t, int> TPZHybridizeHDiv::SplitConnects(const TPZCompElSide &left, const TPZStack<TPZCompElSide> &cellsidestack, TPZVec<TPZCompMesh *> &meshvec_Hybrid, const bool isIntersectEnd) {
    if (fHDivWrapMatid == 0 || fLagrangeInterface == 0) {
        std::cerr << "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!" << std::endl;
        DebugStop();
    }
    
    TPZCompMesh *fluxmesh = meshvec_Hybrid[0];
    
    // All left connect needed variables
    TPZGeoElSide gleft(left.Reference());
    TPZInterpolatedElement *intelleft = dynamic_cast<TPZInterpolatedElement *> (left.Element());
    intelleft->SetSideOrient(left.Side(), 1);
    
    TPZConnect &cleft = intelleft->SideConnect(0, left.Side());
    
    TPZManVector<TPZInterpolatedElement*> intelvec(cellsidestack.size());
    int count = 0;
    if (cleft.HasDependency()){
        DebugStop(); // Please implement me!
    }
    else {
        for (auto& celside : cellsidestack){
            left.SplitConnect(celside);
            
            TPZInterpolatedElement *inteltochange = dynamic_cast<TPZInterpolatedElement *> (celside.Element());
            if (!inteltochange)
                DebugStop();
            inteltochange->SetSideOrient(celside.Side(), 1);
            intelvec[count++] = inteltochange;
        }
    }
    int sideorder = cleft.Order();
    fluxmesh->SetDefaultOrder(sideorder);
            
    // Create HdivBound first for left element
    TPZCompEl *wrapleft;
    TPZManVector<TPZCompEl*> wrapvec(cellsidestack.size());
    {
        for (TPZCompEl* cel : intelvec)
            cel->Reference()->ResetReference();
        intelleft->LoadElementReference();
        intelleft->SetPreferredOrder(sideorder);
        TPZGeoElBC gbc(gleft, fHDivWrapMatid); // creates geoelbc for side
        wrapleft = fluxmesh->ApproxSpace().CreateCompEl(gbc.CreatedElement(), *fluxmesh);
        if(cleft.Order() != sideorder)
        {
            DebugStop();
        }
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *> (wrapleft);
        int wrapside = gbc.CreatedElement()->NSides() - 1;
        intel->SetSideOrient(wrapside, 1);
        intelleft->Reference()->ResetReference();
        wrapleft->Reference()->ResetReference();
    }
    
    // Create HdivBound then for all others
    intelleft->Reference()->ResetReference();
    int i = 0;
    for (TPZCompElSide celside : cellsidestack) {
        TPZInterpolatedElement* intel = intelvec[i];
        intel->LoadElementReference();
        TPZConnect &con = intel->SideConnect(0, celside.Side());
        int prevorder = con.Order();
        intel->SetPreferredOrder(con.Order());
        
        TPZGeoElSide gelside(celside.Reference());
        TPZGeoElBC gbc(gelside,fHDivWrapMatid);
        TPZCompEl* wrap = fluxmesh->ApproxSpace().CreateCompEl(gbc.CreatedElement(), *fluxmesh);
        wrapvec[i++] = wrap;
        if (con.Order() != prevorder)
            DebugStop();
        
        TPZInterpolatedElement* intelwrap = dynamic_cast<TPZInterpolatedElement*>(wrap);
        int wrapside = gbc.CreatedElement()->NSides()-1;
        intelwrap->SetSideOrient(wrapside, 1);
        intel->Reference()->ResetReference();
        wrap->Reference()->ResetReference();
    }
    wrapleft->LoadElementReference();
    for (TPZCompEl* wrap : wrapvec)
        wrap->LoadElementReference();
    
    int64_t pressureindex;
    int pressureorder;
    int lagmatid = fLagrangeInterface;
    if (isIntersectEnd) {
        lagmatid = fLagrangeInterfaceEnd;
    }
    {
      TPZGeoElBC gbc(gleft, lagmatid);
      pressureindex = gbc.CreatedElement()->Index();
      pressureorder = sideorder;
    }
    
    intelleft->LoadElementReference();
    for (TPZInterpolatedElement* intel : intelvec)
        intel->LoadElementReference();
    
    return std::make_tuple(pressureindex,pressureorder);
}